

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O1

void set_want_move(Am_Object *inter,bool want_move)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object main_win;
  Am_Value value;
  Am_Object owner;
  Am_Object win;
  Am_Object obj;
  Am_Value_List new_list;
  Am_Object local_80;
  Am_Value local_78;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Value_List local_48;
  Am_Object local_38;
  
  local_68.data = (Am_Object_Data *)0x0;
  local_80.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object((Am_Object *)&local_78,(Am_Slot_Key)inter,10);
  Am_Object::operator=(&local_68,(Am_Object *)&local_78);
  Am_Object::~Am_Object((Am_Object *)&local_78);
  bVar1 = Am_Object::Valid(&local_68);
  if (!bVar1) goto LAB_001aff36;
  pAVar3 = Am_Object::Get(&local_68,0x68,0);
  Am_Object::operator=(&local_80,pAVar3);
  bVar1 = Am_Object::Valid(&local_80);
  if (bVar1) {
    Am_Object::Am_Object(&local_60,&local_80);
    set_want_move_one_win(&local_60,want_move);
    Am_Object::~Am_Object(&local_60);
  }
  local_78.type = 0;
  local_78.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = Am_Object::Get(inter,0x118,1);
  Am_Value::operator=(&local_78,pAVar3);
  bVar1 = Am_Value::Valid(&local_78);
  if (!bVar1) {
    pAVar3 = Am_Object::Get(inter,0x116,1);
    Am_Value::operator=(&local_78,pAVar3);
  }
  if (local_78.type == 0xa002) {
    Am_Value_List::Am_Value_List(&local_48);
    Am_Value_List::operator=(&local_48,&local_78);
    bVar1 = Am_Object::Valid(&local_80);
    if (bVar1) {
      local_50.data = (Am_Object_Data *)0x0;
      local_58.data = (Am_Object_Data *)0x0;
      Am_Value_List::Start(&local_48);
      while (bVar1 = Am_Value_List::Last(&local_48), !bVar1) {
        pAVar3 = Am_Value_List::Get(&local_48);
        Am_Object::operator=(&local_50,pAVar3);
        pAVar3 = Am_Object::Get(&local_50,0x68,0);
        Am_Object::operator=(&local_58,pAVar3);
        bVar1 = Am_Object::operator!=(&local_58,&local_80);
        if (bVar1) {
          Am_Object::Am_Object(&local_38,&local_58);
          set_want_move_one_win(&local_38,want_move);
          Am_Object::~Am_Object(&local_38);
        }
        Am_Value_List::Next(&local_48);
      }
      Am_Object::~Am_Object(&local_58);
      Am_Object::~Am_Object(&local_50);
    }
    Am_Value_List::~Am_Value_List(&local_48);
  }
  else if (local_78.type == 4) {
    bVar1 = Am_Value::operator_cast_to_bool(&local_78);
    if (bVar1) goto LAB_001afe2e;
  }
  else if ((local_78.type == 2) && (iVar2 = Am_Value::operator_cast_to_int(&local_78), iVar2 != 0))
  {
LAB_001afe2e:
    set_want_move_all_wins(&Am_Window,want_move);
  }
  Am_Value::~Am_Value(&local_78);
LAB_001aff36:
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_68);
  return;
}

Assistant:

static void
set_want_move(const Am_Object &inter, bool want_move)
{
  //first do the main window
  Am_Object owner, main_win;
  owner = inter.Get_Owner();
  if (owner.Valid()) {
    main_win = owner.Get(Am_WINDOW);
    if (main_win.Valid())
      set_want_move_one_win(main_win, want_move);

    // next, do any other windows
    Am_Value value;
    value = inter.Peek(Am_ALL_WINDOWS);
    if (!value.Valid())
      value = inter.Peek(Am_MULTI_OWNERS);
    switch (value.type) {
    case Am_INT:
      if ((int)value != 0)
        //Am_window is root of instance tree
        set_want_move_all_wins(Am_Window, want_move);
      break;
    case Am_BOOL:
      if ((bool)value != false)
        set_want_move_all_wins(Am_Window, want_move);
      break;
    case Am_VALUE_LIST: { //a list of objects
      Am_Value_List new_list;
      new_list = value;
      if (main_win.Valid())
        set_want_move_for_objs_wins(new_list, main_win, want_move);
      break;
    }
    } // end switch on new value
  }
}